

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InstructionFolder::FoldInstructionInternal(InstructionFolder *this,Instruction *inst)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  bool bVar1;
  Instruction *pIVar2;
  FoldingRules *this_00;
  FoldingRuleSet *this_01;
  reference this_02;
  Operand *local_150;
  FoldingRule *rule;
  const_iterator __end2;
  const_iterator __begin2;
  FoldingRuleSet *__range2;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  constants;
  ConstantManager *const_manager;
  iterator local_e0;
  undefined8 local_d8;
  SmallVector<unsigned_int,_2UL> local_d0;
  Operand local_a8;
  iterator local_78;
  _func_int **local_70;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_68;
  function<unsigned_int_(unsigned_int)> local_50;
  Instruction *local_30;
  Instruction *folded_inst;
  Instruction *pIStack_20;
  anon_class_1_0_00000001 identity_map;
  Instruction *inst_local;
  InstructionFolder *this_local;
  
  pIStack_20 = inst;
  std::function<unsigned_int(unsigned_int)>::
  function<spvtools::opt::InstructionFolder::FoldInstructionInternal(spvtools::opt::Instruction*)const::__0&,void>
            ((function<unsigned_int(unsigned_int)> *)&local_50,
             (anon_class_1_0_00000001 *)((long)&folded_inst + 7));
  pIVar2 = FoldInstructionToConstant(this,inst,&local_50);
  std::function<unsigned_int_(unsigned_int)>::~function(&local_50);
  local_30 = pIVar2;
  if (pIVar2 == (Instruction *)0x0) {
    constants.
    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)IRContext::get_constant_mgr(this->context_);
    analysis::ConstantManager::GetOperandConstants
              ((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                *)&__range2,
               (ConstantManager *)
               constants.
               super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,pIStack_20);
    this_00 = GetFoldingRules(this);
    this_01 = FoldingRules::GetRulesForInstruction(this_00,pIStack_20);
    __end2 = std::
             vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
             ::begin(this_01);
    rule = (FoldingRule *)
           std::
           vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
           ::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_*,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>
                                  *)&rule);
      if (!bVar1) break;
      this_02 = __gnu_cxx::
                __normal_iterator<const_std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_*,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>
                ::operator*(&__end2);
      bVar1 = std::
              function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
              ::operator()(this_02,this->context_,pIStack_20,
                           (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                            *)&__range2);
      if (bVar1) {
        this_local._7_1_ = true;
        goto LAB_009c2ac7;
      }
      __gnu_cxx::
      __normal_iterator<const_std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_*,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = false;
LAB_009c2ac7:
    std::
    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *)&__range2);
  }
  else {
    opt::Instruction::SetOpcode(pIStack_20,OpCopyObject);
    pIVar2 = pIStack_20;
    const_manager._4_4_ = opt::Instruction::result_id(local_30);
    local_e0 = (iterator)((long)&const_manager + 4);
    local_d8 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_e0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d0,init_list);
    Operand::Operand(&local_a8,SPV_OPERAND_TYPE_ID,&local_d0);
    local_78 = &local_a8;
    local_70 = (_func_int **)0x1;
    std::allocator<spvtools::opt::Operand>::allocator
              ((allocator<spvtools::opt::Operand> *)((long)&const_manager + 3));
    __l._M_len = (size_type)local_70;
    __l._M_array = local_78;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_68,__l,(allocator_type *)((long)&const_manager + 3));
    opt::Instruction::SetInOperands(pIVar2,&local_68);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_68)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator
              ((allocator<spvtools::opt::Operand> *)((long)&const_manager + 3));
    local_150 = (Operand *)&local_78;
    do {
      local_150 = local_150 + -1;
      Operand::~Operand(local_150);
    } while (local_150 != &local_a8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d0);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool InstructionFolder::FoldInstructionInternal(Instruction* inst) const {
  auto identity_map = [](uint32_t id) { return id; };
  Instruction* folded_inst = FoldInstructionToConstant(inst, identity_map);
  if (folded_inst != nullptr) {
    inst->SetOpcode(spv::Op::OpCopyObject);
    inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {folded_inst->result_id()}}});
    return true;
  }

  analysis::ConstantManager* const_manager = context_->get_constant_mgr();
  std::vector<const analysis::Constant*> constants =
      const_manager->GetOperandConstants(inst);

  for (const FoldingRule& rule :
       GetFoldingRules().GetRulesForInstruction(inst)) {
    if (rule(context_, inst, constants)) {
      return true;
    }
  }
  return false;
}